

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O0

uint llvm::reverseBits<unsigned_int>(uint Val)

{
  uint local_18;
  undefined4 local_14;
  uint i;
  uchar out [4];
  uchar in [4];
  uint Val_local;
  
  i = Val;
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    *(undefined1 *)((long)&local_14 + (3 - (ulong)local_18)) =
         BitReverseTable256[out[(ulong)local_18 - 4]];
  }
  return local_14;
}

Assistant:

T reverseBits(T Val) {
  unsigned char in[sizeof(Val)];
  unsigned char out[sizeof(Val)];
  std::memcpy(in, &Val, sizeof(Val));
  for (unsigned i = 0; i < sizeof(Val); ++i)
    out[(sizeof(Val) - i) - 1] = BitReverseTable256[in[i]];
  std::memcpy(&Val, out, sizeof(Val));
  return Val;
}